

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManchesterAnalyzer.cpp
# Opt level: O1

void __thiscall ManchesterAnalyzer::SetupResults(ManchesterAnalyzer *this)

{
  ManchesterAnalyzerResults *pMVar1;
  ManchesterAnalyzerResults *this_00;
  
  this_00 = (ManchesterAnalyzerResults *)operator_new(0x20);
  ManchesterAnalyzerResults::ManchesterAnalyzerResults(this_00,this,(this->mSettings)._M_ptr);
  pMVar1 = (this->mResults)._M_ptr;
  if (pMVar1 != this_00) {
    if (pMVar1 != (ManchesterAnalyzerResults *)0x0) {
      (**(code **)(*(long *)pMVar1 + 8))();
    }
    (this->mResults)._M_ptr = this_00;
  }
  Analyzer::SetAnalyzerResults((AnalyzerResults *)this);
  AnalyzerResults::AddChannelBubblesWillAppearOn((Channel *)(this->mResults)._M_ptr);
  return;
}

Assistant:

void ManchesterAnalyzer::SetupResults()
{
    mResults.reset( new ManchesterAnalyzerResults( this, mSettings.get() ) );
    SetAnalyzerResults( mResults.get() );
    mResults->AddChannelBubblesWillAppearOn( mSettings->mInputChannel );
}